

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::RepeatedFieldGenerator::RepeatedFieldGenerator
          (RepeatedFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  mapped_type *pmVar1;
  allocator local_31;
  key_type local_30;
  
  ObjCObjFieldGenerator::ObjCObjFieldGenerator
            (&this->super_ObjCObjFieldGenerator,descriptor,options);
  (this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.super_FieldGenerator.
  _vptr_FieldGenerator = (_func_int **)&PTR__SingleFieldGenerator_00428e00;
  std::__cxx11::string::string((string *)&local_30,"array_comment",&local_31);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.
                         super_FieldGenerator.variables_,&local_30);
  std::__cxx11::string::assign((char *)pmVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

RepeatedFieldGenerator::RepeatedFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : ObjCObjFieldGenerator(descriptor, options) {
  // Default to no comment and let the cases needing it fill it in.
  variables_["array_comment"] = "";
}